

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

Ref __thiscall
wasm::Wasm2JSBuilder::processFunctionBody(wasm::Module*,wasm::Function*,bool)::ExpressionProcessor::
blockify(cashew::Ref_(void *this,Ref ast)

{
  bool bVar1;
  Ref *pRVar2;
  Ref local_28;
  Ref ret;
  
  ret.inst = (Value *)this;
  bVar1 = cashew::Ref::operator!(&ret);
  if ((!bVar1) && ((ret.inst)->type == Array)) {
    pRVar2 = cashew::Ref::operator[](&ret,0);
    bVar1 = cashew::Ref::operator==(pRVar2,(IString *)BLOCK);
    if (bVar1) {
      return (Ref)(Value *)this;
    }
  }
  local_28 = cashew::ValueBuilder::makeBlock();
  pRVar2 = cashew::Ref::operator[](&local_28,1);
  cashew::Value::push_back(pRVar2->inst,(Ref)this);
  return (Ref)local_28.inst;
}

Assistant:

Ref blockify(Ref ast) {
      if (isBlock(ast)) {
        return ast;
      }
      Ref ret = ValueBuilder::makeBlock();
      ret[1]->push_back(ValueBuilder::makeStatement(ast));
      return ret;
    }